

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O2

void __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<int,float>::
read_edges<std::vector<std::tuple<int,int,float>,std::allocator<std::tuple<int,int,float>>>>
          (Flag_complex_edge_collapser<int,float> *this,
          vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_> *r)

{
  int iVar1;
  pointer ptVar2;
  tuple<int,_int,_float> *e;
  pointer ptVar3;
  int v;
  int u;
  undefined4 uStack_54;
  float f;
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  neighbors_seq;
  
  std::
  vector<boost::container::flat_map<int,_float,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_float,_std::less<int>,_void>_>_>
  ::resize((vector<boost::container::flat_map<int,_float,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_float,_std::less<int>,_void>_>_>
            *)this,*(size_type *)(this + 0x18));
  std::
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  ::vector(&neighbors_seq,*(size_type *)(this + 0x18),(allocator_type *)&u);
  ptVar2 = (r->
           super__Vector_base<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar3 = (r->
                super__Vector_base<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ptVar3 != ptVar2; ptVar3 = ptVar3 + 1) {
    iVar1 = (ptVar3->super__Tuple_impl<0UL,_int,_int,_float>).super__Head_base<0UL,_int,_false>.
            _M_head_impl;
    _u = CONCAT44(uStack_54,iVar1);
    v = (ptVar3->super__Tuple_impl<0UL,_int,_int,_float>).super__Tuple_impl<1UL,_int,_float>.
        super__Head_base<1UL,_int,_false>._M_head_impl;
    f = (ptVar3->super__Tuple_impl<0UL,_int,_int,_float>).super__Tuple_impl<1UL,_int,_float>.
        super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl;
    boost::container::
    vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
    emplace_back<int&,float&>
              ((vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
                *)(neighbors_seq.
                   super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar1),&v,&f);
    boost::container::
    vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
    emplace_back<int&,float&>
              ((vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
                *)(neighbors_seq.
                   super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + v),&u,&f);
  }
  _u = 0;
  while( true ) {
    if ((ulong)(((long)neighbors_seq.
                       super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)neighbors_seq.
                      super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= _u) break;
    v = -0x800000;
    boost::container::
    vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
    emplace_back<unsigned_long&,float>
              ((vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
                *)(neighbors_seq.
                   super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + _u),(unsigned_long *)&u,(float *)&v);
    boost::container::dtl::
    flat_tree_adopt_sequence_unique<boost::container::vector<boost::container::dtl::pair<int,float>,boost::container::new_allocator<boost::container::dtl::pair<int,float>>,void>,boost::container::dtl::flat_tree_value_compare<std::less<int>,boost::container::dtl::pair<int,float>,boost::container::dtl::select1st<int>>>
              (*(long *)this + _u * 0x18,
               neighbors_seq.
               super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start + _u);
    _u = _u + 1;
  }
  std::
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  ::~vector(&neighbors_seq);
  return;
}

Assistant:

void read_edges(FilteredEdgeRange const&r){
    neighbors.resize(num_vertices);
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    init_neighbors_dense();
#endif
    // Use the raw sequence to avoid maintaining the order
    std::vector<typename Ngb_list::sequence_type> neighbors_seq(num_vertices);
    for(auto&&e : r){
      using std::get;
      Vertex u = get<0>(e);
      Vertex v = get<1>(e);
      Filtration_value f = get<2>(e);
      neighbors_seq[u].emplace_back(v, f);
      neighbors_seq[v].emplace_back(u, f);
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
      neighbors_dense(u,v)=f;
      neighbors_dense(v,u)=f;
#endif
    }
    for(std::size_t i=0;i<neighbors_seq.size();++i){
      neighbors_seq[i].emplace_back(i, -std::numeric_limits<Filtration_value>::infinity());
      neighbors[i].adopt_sequence(std::move(neighbors_seq[i])); // calls sort
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
      neighbors_dense(i,i)=-std::numeric_limits<Filtration_value>::infinity();
#endif
    }
  }